

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_endStream(ZSTD_CStream *zcs,ZSTD_outBuffer *output)

{
  size_t sVar1;
  ulong uVar2;
  bool bVar3;
  ZSTD_inBuffer input;
  
  input.pos = 0;
  input.src = (void *)0x0;
  input.size = 0;
  if (output->size < output->pos) {
    sVar1 = 0xffffffffffffffff;
  }
  else {
    sVar1 = ZSTD_compressStream_generic(zcs,output,&input,ZSTD_e_end);
    if (sVar1 < 0xffffffffffffff89) {
      bVar3 = zcs->frameEnded == 0;
      if (bVar3) {
        uVar2 = (ulong)((zcs->appliedParams).fParams.checksumFlag << 2);
      }
      else {
        uVar2 = 0;
      }
      sVar1 = (uVar2 + (ulong)bVar3 * 3 + zcs->outBuffContentSize) - zcs->outBuffFlushedSize;
    }
  }
  return sVar1;
}

Assistant:

size_t ZSTD_endStream(ZSTD_CStream* zcs, ZSTD_outBuffer* output)
{
    ZSTD_inBuffer input = { NULL, 0, 0 };
    if (output->pos > output->size) return ERROR(GENERIC);
    CHECK_F( ZSTD_compressStream_generic(zcs, output, &input, ZSTD_e_end) );
    {   size_t const lastBlockSize = zcs->frameEnded ? 0 : ZSTD_BLOCKHEADERSIZE;
        size_t const checksumSize = zcs->frameEnded ? 0 : zcs->appliedParams.fParams.checksumFlag * 4;
        size_t const toFlush = zcs->outBuffContentSize - zcs->outBuffFlushedSize + lastBlockSize + checksumSize;
        DEBUGLOG(4, "ZSTD_endStream : remaining to flush : %u", (U32)toFlush);
        return toFlush;
    }
}